

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O1

void __thiscall
multiple_messagescase::_impl<picnic_params_t>(multiple_messagescase *this,anon_enum_32 *parameters)

{
  lazy_ostream *assertion_descr;
  bool bVar1;
  int iVar2;
  size_type __new_size;
  context_frame context_frame_790;
  size_t signature_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  picnic_publickey_t pk;
  picnic_privatekey_t sk;
  value_expr<int> local_298;
  context_frame local_294;
  undefined1 local_290 [24];
  char *local_278;
  undefined1 *local_270;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_268;
  size_type local_260;
  assertion_result local_258;
  size_type local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  assertion_result local_218;
  assertion_result local_200;
  char *local_1e8;
  const_string local_1b8;
  const_string local_1a8;
  const_string local_198;
  const_string local_188;
  const_string local_178;
  const_string local_168;
  const_string local_158;
  const_string local_148;
  const_string local_138;
  const_string local_128;
  const_string local_118;
  const_string local_108;
  const_string local_f8;
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  const_string local_a8;
  lazy_ostream local_98;
  undefined ***local_88;
  undefined1 *local_80;
  
  local_200.m_message.px._0_1_ = 0;
  local_200._0_8_ = &PTR__lazy_ostream_00184600;
  local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e8 = "Parameter set: ";
  local_290._16_8_ = picnic_get_param_name(*parameters);
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00186760;
  local_88 = (undefined ***)&local_200;
  local_80 = local_290 + 0x10;
  boost::test_tools::tt_detail::context_frame::context_frame(&local_294,&local_98);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_294);
  if (bVar1) {
    local_240 = picnic_signature_size(*parameters);
    local_a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_a8.m_end = "";
    local_b8.m_begin = "";
    local_b8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x51,&local_b8);
    local_258._0_8_ = &local_240;
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              (&local_200,(value_expr<const_unsigned_long_&> *)&local_258,false);
    local_290._16_8_ = "max_signature_size";
    local_278 = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001867a0;
    local_88 = (undefined ***)boost::unit_test::lazy_ostream::inst;
    local_c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_c8.m_end = "";
    local_80 = local_290 + 0x10;
    boost::test_tools::tt_detail::report_assertion
              (&local_200,&local_98,&local_c8,0x51,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
    local_d8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_d8.m_end = "";
    local_e8.m_begin = "";
    local_e8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x55,&local_e8);
    iVar2 = picnic_keygen(*parameters,&local_200,&local_98);
    local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (&local_258,(value_expr<bool> *)&local_218,false);
    local_268 = &local_238;
    local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!picnic_keygen(parameters, &pk, &sk)";
    local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
    local_290._16_8_ = &PTR__lazy_ostream_001867a0;
    local_270 = boost::unit_test::lazy_ostream::inst;
    local_f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_f8.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_258,(lazy_ostream *)(local_290 + 0x10),&local_f8,0x55,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
    local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_258._0_8_ = (unsigned_long *)0x0;
    local_258.m_message.px = (element_type *)0x0;
    local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = 0x200;
    assertion_descr = (lazy_ostream *)(local_290 + 0x10);
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_258,local_240);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_238,__new_size);
      (anonymous_namespace)::
      randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_238);
      (anonymous_namespace)::
      randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_258);
      local_260 = local_240;
      local_108.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_108.m_end = "";
      local_118.m_begin = "";
      local_118.m_end = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x62,&local_118);
      iVar2 = picnic_sign(&local_98,
                          local_238.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,__new_size,local_258._0_8_,&local_260);
      local_298.m_value._0_1_ = iVar2 == 0;
      boost::test_tools::assertion::value_expr<bool>::evaluate
                (&local_218,(value_expr<bool> *)&local_298,false);
      local_290._0_8_ =
           "!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)";
      local_290._8_8_ = "";
      local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
      local_290._16_8_ = &PTR__lazy_ostream_001867a0;
      local_270 = boost::unit_test::lazy_ostream::inst;
      local_268 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290;
      local_128.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_128.m_end = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_218,assertion_descr,&local_128,0x62,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
      local_138.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_138.m_end = "";
      local_148.m_begin = "";
      local_148.m_end = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,100,&local_148);
      iVar2 = picnic_verify(&local_200,
                            local_238.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,__new_size,local_258._0_8_,
                            local_260);
      local_298.m_value._0_1_ = iVar2 == 0;
      boost::test_tools::assertion::value_expr<bool>::evaluate
                (&local_218,(value_expr<bool> *)&local_298,false);
      local_290._0_8_ =
           "!picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len)";
      local_290._8_8_ = "";
      local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
      local_290._16_8_ = &PTR__lazy_ostream_001867a0;
      local_270 = boost::unit_test::lazy_ostream::inst;
      local_268 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290;
      local_158.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_158.m_end = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_218,assertion_descr,&local_158,100,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
      local_168.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_168.m_end = "";
      local_178.m_begin = "";
      local_178.m_end = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x67,&local_178);
      local_298.m_value =
           picnic_verify(&local_200,
                         local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,__new_size - 1,local_258._0_8_,
                         local_260);
      boost::test_tools::assertion::value_expr<int>::evaluate(&local_218,&local_298,false);
      local_290._0_8_ =
           "picnic_verify(&pk, message.data(), message_size - 1, signature.data(), signature_len)";
      local_290._8_8_ = "";
      local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
      local_290._16_8_ = &PTR__lazy_ostream_001867a0;
      local_270 = boost::unit_test::lazy_ostream::inst;
      local_268 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290;
      local_188.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_188.m_end = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_218,assertion_descr,&local_188,0x67,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
      local_198.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_198.m_end = "";
      local_1a8.m_begin = "";
      local_1a8.m_end = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x6a,&local_1a8);
      local_298.m_value =
           picnic_verify(&local_200,
                         local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,__new_size,local_258._0_8_,
                         local_260 - 1);
      boost::test_tools::assertion::value_expr<int>::evaluate(&local_218,&local_298,false);
      local_290._0_8_ =
           "picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len - 1)";
      local_290._8_8_ = "";
      local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
      local_290._16_8_ = &PTR__lazy_ostream_001867a0;
      local_270 = boost::unit_test::lazy_ostream::inst;
      local_268 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290;
      local_1b8.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_1b8.m_end = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_218,assertion_descr,&local_1b8,0x6a,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
      __new_size = __new_size + 0x200;
    } while (__new_size != 0x4200);
    if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((unsigned_long *)local_258._0_8_ != (unsigned_long *)0x0) {
      operator_delete((void *)local_258._0_8_);
    }
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&local_294);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(multiple_messages, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    for (size_t c = 0; c < rep; ++c) {
      const size_t message_size = (c + 1) * message_inc;

      signature.resize(max_signature_size);
      message.resize(message_size);
      // fill with random data
      randomize_container(message);
      randomize_container(signature);

      size_t signature_len = max_signature_size;
      BOOST_TEST(!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
      BOOST_TEST(
          !picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len));
      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size - 1, signature.data(), signature_len));
      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len - 1));
    }
  }
}